

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_rect_pack.h
# Opt level: O2

int stbrp_pack_rects(stbrp_context *context,stbrp_rect *rects,int num_rects)

{
  stbrp_node **ppsVar1;
  stbrp_rect *psVar2;
  ushort uVar3;
  ushort uVar4;
  stbrp_node *psVar5;
  stbrp_node *psVar6;
  stbrp_context *psVar7;
  uint uVar8;
  uint uVar9;
  int *piVar10;
  stbrp_node **ppsVar11;
  long lVar12;
  int *piVar13;
  stbrp_node *psVar14;
  int iVar15;
  uint uVar16;
  stbrp_node **ppsVar17;
  int iVar18;
  int *piVar19;
  stbrp_context *psVar20;
  stbrp_context *psVar21;
  uint local_8c;
  uint local_88;
  int local_84;
  stbrp_node **local_80;
  int local_68;
  int waste;
  size_t local_60;
  int *local_58;
  stbrp_rect *local_50;
  ulong local_48;
  stbrp_rect *local_40;
  int *local_38;
  
  piVar10 = (int *)0x0;
  piVar19 = (int *)0x0;
  if (0 < num_rects) {
    piVar19 = (int *)(ulong)(uint)num_rects;
  }
  piVar13 = &rects->was_packed;
  for (; piVar19 != piVar10; piVar10 = (int *)((long)piVar10 + 1)) {
    *piVar13 = (int)piVar10;
    piVar13 = piVar13 + 4;
  }
  local_60 = (size_t)num_rects;
  qsort(rects,local_60,0x10,rect_height_compare);
  ppsVar1 = &context->active_head;
  piVar10 = (int *)0x0;
  local_58 = piVar19;
  local_50 = rects;
  do {
    if (piVar10 == piVar19) {
      qsort(rects,local_60,0x10,rect_original_order);
      for (lVar12 = 0; (long)piVar19 * 0x10 != lVar12; lVar12 = lVar12 + 0x10) {
        uVar16 = 1;
        if (*(short *)((long)&rects->x + lVar12) == -1) {
          uVar16 = (uint)(*(short *)((long)&rects->y + lVar12) != -1);
        }
        *(uint *)((long)&rects->was_packed + lVar12) = uVar16;
      }
      return (int)lVar12;
    }
    psVar2 = rects + (long)piVar10;
    uVar3 = rects[(long)piVar10].w;
    if ((uVar3 == 0) || (uVar4 = psVar2->h, uVar4 == 0)) {
      psVar2->x = 0;
      psVar2->y = 0;
    }
    else {
      iVar15 = context->align;
      iVar18 = (uint)uVar3 + iVar15 + -1;
      iVar18 = iVar18 - iVar18 % iVar15;
      local_48 = (ulong)uVar3;
      local_40 = psVar2;
      local_38 = piVar10;
      if (iVar18 % iVar15 != 0) {
        __assert_fail("width % c->align == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/stb_rect_pack.h"
                      ,0x15e,
                      "stbrp__findresult stbrp__skyline_find_best_pos(stbrp_context *, int, int)");
      }
      local_8c = 0x40000000;
      local_80 = (stbrp_node **)0x0;
      local_84 = 0x40000000;
      ppsVar17 = ppsVar1;
      psVar21 = (stbrp_context *)*ppsVar1;
      while( true ) {
        uVar3 = (ushort)psVar21->width;
        uVar16 = (uint)uVar4;
        if (context->width < (int)((uint)uVar3 + iVar18)) break;
        uVar8 = stbrp__skyline_find_min_y
                          (psVar21,(stbrp_node *)(ulong)uVar3,iVar18,(int)&waste,piVar10);
        if (context->heuristic == 0) {
          if ((int)uVar8 < (int)local_8c) {
            local_8c = uVar8;
            local_80 = ppsVar17;
          }
        }
        else if (((int)(uVar16 + uVar8) <= context->height) &&
                (((int)uVar8 < (int)local_8c || (waste < local_84 && uVar8 == local_8c)))) {
          local_84 = waste;
          local_8c = uVar8;
          local_80 = ppsVar17;
        }
        ppsVar17 = (stbrp_node **)&psVar21->align;
        psVar21 = *(stbrp_context **)&psVar21->align;
      }
      if (local_80 == (stbrp_node **)0x0) {
        local_88 = 0;
      }
      else {
        local_88 = (uint)(*local_80)->x;
      }
      if (context->heuristic == 1) {
        psVar21 = (stbrp_context *)*ppsVar1;
        psVar20 = psVar21;
        while (ppsVar17 = ppsVar1, (int)(uint)(ushort)psVar20->width < iVar18) {
          psVar20 = *(stbrp_context **)&psVar20->align;
        }
        for (; rects = local_50, piVar19 = local_58, psVar20 != (stbrp_context *)0x0;
            psVar20 = *(stbrp_context **)&psVar20->align) {
          uVar8 = (uint)(ushort)psVar20->width - iVar18;
          psVar7 = psVar21;
          if ((int)uVar8 < 0) {
            __assert_fail("xpos >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/stb_rect_pack.h"
                          ,0x197,
                          "stbrp__findresult stbrp__skyline_find_best_pos(stbrp_context *, int, int)"
                         );
          }
          do {
            psVar21 = psVar7;
            ppsVar11 = ppsVar17;
            ppsVar17 = (stbrp_node **)&psVar21->align;
            psVar7 = *(stbrp_context **)&psVar21->align;
          } while ((ushort)(*(stbrp_context **)&psVar21->align)->width <= uVar8);
          if (uVar8 < (ushort)psVar21->width) {
            __assert_fail("node->next->x > xpos && node->x <= xpos",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/stb_rect_pack.h"
                          ,0x19d,
                          "stbrp__findresult stbrp__skyline_find_best_pos(stbrp_context *, int, int)"
                         );
          }
          uVar9 = stbrp__skyline_find_min_y
                            (psVar21,(stbrp_node *)(ulong)uVar8,iVar18,(int)&local_68,piVar10);
          if ((((int)(uVar16 + uVar9) < context->height) && ((int)uVar9 <= (int)local_8c)) &&
             (((uVar9 < local_8c || (local_68 < local_84)) ||
              ((local_68 == local_84 && ((int)uVar8 < (int)local_88)))))) {
            local_84 = local_68;
            local_8c = uVar9;
            local_88 = uVar8;
            local_80 = ppsVar11;
          }
          ppsVar17 = ppsVar11;
        }
      }
      piVar10 = local_38;
      if (((local_80 == (stbrp_node **)0x0) || (context->height < (int)(uVar16 + local_8c))) ||
         (psVar5 = context->free_head, psVar5 == (stbrp_node *)0x0)) {
        local_40->x = 0xffff;
        local_40->y = 0xffff;
      }
      else {
        psVar5->x = (stbrp_coord)local_88;
        psVar5->y = (stbrp_coord)(uVar16 + local_8c);
        context->free_head = psVar5->next;
        psVar6 = *local_80;
        psVar14 = psVar6;
        if ((int)(uint)psVar6->x < (int)local_88) {
          psVar14 = psVar6->next;
          local_80 = &psVar6->next;
        }
        *local_80 = psVar5;
        iVar15 = local_88 + (int)local_48;
        while ((psVar6 = psVar14->next, psVar6 != (stbrp_node *)0x0 &&
               ((int)(uint)psVar6->x <= iVar15))) {
          psVar14->next = context->free_head;
          context->free_head = psVar14;
          psVar14 = psVar6;
        }
        psVar5->next = psVar14;
        if ((int)(uint)psVar14->x < iVar15) {
          psVar14->x = (stbrp_coord)iVar15;
        }
        local_40->x = (stbrp_coord)local_88;
        local_40->y = (stbrp_coord)local_8c;
      }
    }
    piVar10 = (int *)((long)piVar10 + 1);
  } while( true );
}

Assistant:

STBRP_DEF int stbrp_pack_rects(stbrp_context *context, stbrp_rect *rects, int num_rects)
{
   int i, all_rects_packed = 1;

   // we use the 'was_packed' field internally to allow sorting/unsorting
   for (i=0; i < num_rects; ++i) {
      rects[i].was_packed = i;
      #ifndef STBRP_LARGE_RECTS
      STBRP_ASSERT(rects[i].w <= 0xffff && rects[i].h <= 0xffff);
      #endif
   }

   // sort according to heuristic
   STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_height_compare);

   for (i=0; i < num_rects; ++i) {
      if (rects[i].w == 0 || rects[i].h == 0) {
         rects[i].x = rects[i].y = 0;  // empty rect needs no space
      } else {
         stbrp__findresult fr = stbrp__skyline_pack_rectangle(context, rects[i].w, rects[i].h);
         if (fr.prev_link) {
            rects[i].x = (stbrp_coord) fr.x;
            rects[i].y = (stbrp_coord) fr.y;
         } else {
            rects[i].x = rects[i].y = STBRP__MAXVAL;
         }
      }
   }

   // unsort
   STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_original_order);

   // set was_packed flags and all_rects_packed status
   for (i=0; i < num_rects; ++i) {
      rects[i].was_packed = !(rects[i].x == STBRP__MAXVAL && rects[i].y == STBRP__MAXVAL);
      if (!rects[i].was_packed)
         all_rects_packed = 0;
   }

   // return the all_rects_packed status
   return all_rects_packed;
}